

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

bam_hdr_t * bam_hdr_read(BGZF *fp)

{
  int iVar1;
  ssize_t sVar2;
  char *pcVar3;
  char **ppcVar4;
  uint32_t *puVar5;
  int local_34;
  int local_30;
  int32_t name_len;
  int32_t i;
  int has_EOF;
  int magic_len;
  char buf [4];
  bam_hdr_t *h;
  BGZF *fp_local;
  
  local_30 = 1;
  name_len = bgzf_check_EOF(fp);
  if (name_len < 0) {
    perror("[W::sam_hdr_read] bgzf_check_EOF");
  }
  else if ((name_len == 0) && (1 < hts_verbose)) {
    fprintf(_stderr,"[W::%s] EOF marker is absent. The input is probably truncated.\n",
            "bam_hdr_read");
  }
  sVar2 = bgzf_read(fp,&has_EOF,4);
  i = (int32_t)sVar2;
  if ((i == 4) && (iVar1 = strncmp((char *)&has_EOF,"BAM\x01",4), iVar1 == 0)) {
    _magic_len = (BGZF *)bam_hdr_init();
    bgzf_read(fp,&_magic_len->block_length,4);
    if ((*(int *)fp << 0xc) >> 0x1e != 0) {
      ed_swap_4p(&_magic_len->block_length);
    }
    pcVar3 = (char *)malloc((ulong)(_magic_len->block_length + 1));
    _magic_len->compressed_block = pcVar3;
    *(char *)((long)_magic_len->compressed_block + (ulong)(uint)_magic_len->block_length) = '\0';
    bgzf_read(fp,_magic_len->compressed_block,(ulong)(uint)_magic_len->block_length);
    bgzf_read(fp,_magic_len,4);
    if ((*(int *)fp << 0xc) >> 0x1e != 0) {
      ed_swap_4p(_magic_len);
    }
    ppcVar4 = (char **)calloc((long)*(int *)_magic_len,8);
    _magic_len->uncompressed_block = ppcVar4;
    puVar5 = (uint32_t *)calloc((long)*(int *)_magic_len,4);
    _magic_len->block_address = (int64_t)puVar5;
    for (local_30 = 0; local_30 != *(int *)_magic_len; local_30 = local_30 + 1) {
      bgzf_read(fp,&local_34,4);
      if ((*(int *)fp << 0xc) >> 0x1e != 0) {
        ed_swap_4p(&local_34);
      }
      pcVar3 = (char *)calloc((long)local_34,1);
      *(char **)((long)_magic_len->uncompressed_block + (long)local_30 * 8) = pcVar3;
      bgzf_read(fp,*(char **)((long)_magic_len->uncompressed_block + (long)local_30 * 8),
                (long)local_34);
      bgzf_read(fp,(uint32_t *)_magic_len->block_address + local_30,4);
      if ((*(int *)fp << 0xc) >> 0x1e != 0) {
        ed_swap_4p((uint32_t *)_magic_len->block_address + local_30);
      }
    }
    fp_local = _magic_len;
  }
  else {
    if (0 < hts_verbose) {
      fprintf(_stderr,"[E::%s] invalid BAM binary header\n","bam_hdr_read");
    }
    fp_local = (BGZF *)0x0;
  }
  return (bam_hdr_t *)fp_local;
}

Assistant:

bam_hdr_t *bam_hdr_read(BGZF *fp)
{
    bam_hdr_t *h;
    char buf[4];
    int magic_len, has_EOF;
    int32_t i = 1, name_len;
    // check EOF
    has_EOF = bgzf_check_EOF(fp);
    if (has_EOF < 0) {
        perror("[W::sam_hdr_read] bgzf_check_EOF");
    } else if (has_EOF == 0 && hts_verbose >= 2)
        fprintf(stderr, "[W::%s] EOF marker is absent. The input is probably truncated.\n", __func__);
    // read "BAM1"
    magic_len = bgzf_read(fp, buf, 4);
    if (magic_len != 4 || strncmp(buf, "BAM\1", 4)) {
        if (hts_verbose >= 1) fprintf(stderr, "[E::%s] invalid BAM binary header\n", __func__);
        return 0;
    }
    h = bam_hdr_init();
    // read plain text and the number of reference sequences
    bgzf_read(fp, &h->l_text, 4);
    if (fp->is_be) ed_swap_4p(&h->l_text);
    h->text = (char*)malloc(h->l_text + 1);
    h->text[h->l_text] = 0; // make sure it is NULL terminated
    bgzf_read(fp, h->text, h->l_text);
    bgzf_read(fp, &h->n_targets, 4);
    if (fp->is_be) ed_swap_4p(&h->n_targets);
    // read reference sequence names and lengths
    h->target_name = (char**)calloc(h->n_targets, sizeof(char*));
    h->target_len = (uint32_t*)calloc(h->n_targets, sizeof(uint32_t));
    for (i = 0; i != h->n_targets; ++i) {
        bgzf_read(fp, &name_len, 4);
        if (fp->is_be) ed_swap_4p(&name_len);
        h->target_name[i] = (char*)calloc(name_len, 1);
        bgzf_read(fp, h->target_name[i], name_len);
        bgzf_read(fp, &h->target_len[i], 4);
        if (fp->is_be) ed_swap_4p(&h->target_len[i]);
    }
    return h;
}